

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O2

energy_t __thiscall
s_energy_matrix::compute_internal_restricted
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,paramT *params,
          vector<int,_std::allocator<int>_> *up)

{
  int type;
  short *psVar1;
  int iVar2;
  int i_00;
  int iVar3;
  energy_t eVar4;
  int iVar5;
  int iVar6;
  int n2;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = j + -5;
  if (i + 0x1f < j + -5) {
    iVar2 = i + 0x1f;
  }
  type = pair[this->S_[i]][this->S_[j]];
  lVar8 = (long)(j + -1);
  iVar6 = 10000000;
  for (lVar7 = (long)(i + 1); lVar7 <= iVar2; lVar7 = lVar7 + 1) {
    i_00 = (int)lVar7;
    if (i_00 + ~i <=
        (up->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
        [lVar7 + -1]) {
      iVar5 = (j - i) + i_00;
      if (iVar5 < i_00 + 0x24) {
        iVar5 = i_00 + 0x24;
      }
      n2 = 0;
      for (lVar9 = lVar8; iVar5 + -0x20 <= lVar9; lVar9 = lVar9 + -1) {
        if (n2 <= (up->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8]) {
          psVar1 = this->S1_;
          iVar3 = E_IntLoop(i_00 + ~i,n2,type,rtype[pair[this->S_[lVar7]][this->S_[lVar9]]],
                            (int)psVar1[i + 1],(int)psVar1[lVar8],(int)psVar1[lVar7 + -1],
                            (int)psVar1[lVar9 + 1],params);
          eVar4 = get_energy(this,i_00,(cand_pos_t)lVar9);
          if (eVar4 + iVar3 < iVar6) {
            iVar6 = eVar4 + iVar3;
          }
        }
        n2 = n2 + 1;
      }
    }
  }
  return iVar6;
}

Assistant:

energy_t s_energy_matrix::compute_internal_restricted(cand_pos_t i, cand_pos_t j, const paramT *params, std::vector<int> &up){
	energy_t v_iloop = INF;
	cand_pos_t max_k = std::min(j-TURN-2,i+MAXLOOP+1);
	const int ptype_closing = pair[S_[i]][S_[j]];
	for ( cand_pos_t k=i+1; k<=max_k; ++k) {
		
		cand_pos_t min_l=std::max(k+TURN+1 + MAXLOOP+2, k+j-i) - MAXLOOP-2;
        if((up[k-1]>=(k-i-1))){
            for (int l=j-1; l>=min_l; --l) {
                if(up[j-1]>=(j-l-1)){
                    energy_t v_iloop_kl = E_IntLoop(k-i-1,j-l-1,ptype_closing,rtype[pair[S_[k]][S_[l]]],S1_[i+1],S1_[j-1],S1_[k-1],S1_[l+1],const_cast<paramT *>(params)) + get_energy(k,l);
                    v_iloop = std::min(v_iloop,v_iloop_kl);
                }
            }
        }
	}
	return v_iloop;
}